

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locid.cpp
# Opt level: O0

void __thiscall
icu_63::Locale::setUnicodeKeywordValue
          (Locale *this,StringPiece keywordName,StringPiece keywordValue,UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  char *pcVar3;
  char *value;
  StringPiece s;
  StringPiece s_00;
  char *legacy_value;
  char *legacy_key;
  undefined1 local_c8 [8];
  CharString keywordValue_nul;
  undefined1 local_78 [8];
  CharString keywordName_nul;
  UErrorCode *status_local;
  Locale *this_local;
  StringPiece keywordValue_local;
  StringPiece keywordName_local;
  
  keywordValue_nul._56_8_ = keywordName.ptr_;
  s._12_4_ = 0;
  s.ptr_ = (char *)SUB128(keywordName._0_12_,0);
  s.length_ = SUB124(keywordName._0_12_,8);
  keywordName_nul._56_8_ = status;
  CharString::CharString((CharString *)local_78,s,status);
  s_00._12_4_ = 0;
  s_00.ptr_ = (char *)SUB128(keywordValue._0_12_,0);
  s_00.length_ = SUB124(keywordValue._0_12_,8);
  CharString::CharString((CharString *)local_c8,s_00,(UErrorCode *)keywordName_nul._56_8_);
  UVar1 = ::U_FAILURE(*(UErrorCode *)keywordName_nul._56_8_);
  if (UVar1 == '\0') {
    pcVar2 = CharString::data((CharString *)local_78);
    pcVar2 = uloc_toLegacyKey_63(pcVar2);
    if (pcVar2 == (char *)0x0) {
      *(undefined4 *)keywordName_nul._56_8_ = 1;
    }
    else {
      pcVar3 = CharString::data((CharString *)local_78);
      value = CharString::data((CharString *)local_c8);
      pcVar3 = uloc_toLegacyType_63(pcVar3,value);
      if (pcVar3 == (char *)0x0) {
        *(undefined4 *)keywordName_nul._56_8_ = 1;
      }
      else {
        setKeywordValue(this,pcVar2,pcVar3,(UErrorCode *)keywordName_nul._56_8_);
      }
    }
  }
  CharString::~CharString((CharString *)local_c8);
  CharString::~CharString((CharString *)local_78);
  return;
}

Assistant:

void
Locale::setUnicodeKeywordValue(StringPiece keywordName,
                               StringPiece keywordValue,
                               UErrorCode& status) {
    // TODO: Remove the need for a const char* to a NUL terminated buffer.
    const CharString keywordName_nul(keywordName, status);
    const CharString keywordValue_nul(keywordValue, status);

    if (U_FAILURE(status)) {
        return;
    }

    const char* legacy_key = uloc_toLegacyKey(keywordName_nul.data());

    if (legacy_key == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    const char* legacy_value =
        uloc_toLegacyType(keywordName_nul.data(), keywordValue_nul.data());

    if (legacy_value == nullptr) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    setKeywordValue(legacy_key, legacy_value, status);
}